

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O1

BtorSimBitVector * btorsim_bv_sll(BtorSimBitVector *a,BtorSimBitVector *b)

{
  uint32_t uVar1;
  ulong uVar2;
  BtorSimBitVector *pBVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  
  uVar4 = b->width;
  if (uVar4 < 0x41) {
    uVar4 = b->len;
    uVar2 = (ulong)uVar4;
    if (uVar2 == 0) {
      uVar1 = 0;
    }
    else {
      lVar5 = 0;
      uVar6 = 0;
      do {
        uVar4 = uVar4 - 1;
        uVar6 = uVar6 | (ulong)*(uint *)((long)&b[1].width + lVar5) << ((char)uVar4 * ' ' & 0x3fU);
        uVar1 = (uint32_t)uVar6;
        lVar5 = lVar5 + 4;
      } while (uVar2 << 2 != lVar5);
    }
  }
  else {
    uVar1 = btorsim_bv_get_num_leading_zeros(b);
    if (uVar1 < uVar4 - 0x40) {
      pBVar3 = btorsim_bv_new(a->width);
      return pBVar3;
    }
    uVar1 = 0;
    pBVar3 = btorsim_bv_slice(b,0x3f,0);
    uVar4 = pBVar3->len;
    uVar2 = (ulong)uVar4;
    if (uVar2 != 0) {
      lVar5 = 0;
      uVar6 = 0;
      do {
        uVar4 = uVar4 - 1;
        uVar6 = uVar6 | (ulong)*(uint *)((long)&pBVar3[1].width + lVar5) <<
                        ((char)uVar4 * ' ' & 0x3fU);
        uVar1 = (uint32_t)uVar6;
        lVar5 = lVar5 + 4;
      } while (uVar2 << 2 != lVar5);
    }
    free(pBVar3);
  }
  pBVar3 = sll_bv(a,uVar1);
  return pBVar3;
}

Assistant:

BtorSimBitVector *
btorsim_bv_sll (const BtorSimBitVector *a, const BtorSimBitVector *b)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  uint64_t shift;
  BtorSimBitVector *res;
  if (b->width <= 64)
    shift = btorsim_bv_to_uint64 (b);
  else
  {
    if (btorsim_bv_get_num_leading_zeros (b) < (b->width - 64))
      return btorsim_bv_new (a->width);
    BtorSimBitVector *lower = btorsim_bv_slice (b, 63, 0);
    shift                   = btorsim_bv_to_uint64 (lower);
    btorsim_bv_free (lower);
  }
  res = sll_bv (a, shift);
  return res;
}